

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip.c
# Opt level: O0

int lrtr_ip_str_to_addr(char *str,lrtr_ip_addr *ip)

{
  long lVar1;
  char *pcVar2;
  long in_FS_OFFSET;
  lrtr_ip_addr *ip_local;
  char *str_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar2 = strchr(str,0x3a);
  if (pcVar2 == (char *)0x0) {
    ip->ver = LRTR_IPV4;
    str_local._4_4_ = lrtr_ipv4_str_to_addr(str,&(ip->u).addr4);
  }
  else {
    ip->ver = LRTR_IPV6;
    str_local._4_4_ = lrtr_ipv6_str_to_addr(str,&(ip->u).addr6);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return str_local._4_4_;
  }
  __stack_chk_fail();
}

Assistant:

RTRLIB_EXPORT int lrtr_ip_str_to_addr(const char *str, struct lrtr_ip_addr *ip)
{
	if (!strchr(str, ':')) {
		ip->ver = LRTR_IPV4;
		return lrtr_ipv4_str_to_addr(str, &(ip->u.addr4));
	}
	ip->ver = LRTR_IPV6;
	return lrtr_ipv6_str_to_addr(str, &(ip->u.addr6));
}